

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder_utils.c
# Opt level: O1

void av1_determine_sc_tools_with_encoding(AV1_COMP *cpi,int q_orig)

{
  AV1_COMMON *cm;
  segmentation *seg;
  undefined8 uVar1;
  _Bool _Var2;
  _Bool _Var3;
  PARTITION_SEARCH_TYPE PVar4;
  BLOCK_SIZE BVar5;
  RefCntBuffer *pRVar6;
  YV12_BUFFER_CONFIG *pYVar7;
  int16_t (*paiVar8) [8];
  int16_t (*paiVar9) [8];
  int q;
  long lVar10;
  long lVar11;
  bool bVar12;
  _Bool _Var13;
  undefined8 uVar14;
  double dVar15;
  PSNR_STATS psnr [3];
  
  if ((cpi->sf).rt_sf.use_nonrd_pick_mode != 0) {
    return;
  }
  if ((((cpi->oxcf).kf_cfg.fwd_kf_enabled == false) && (cpi->superres_mode == AOM_SUPERRES_NONE)) &&
     ((cpi->oxcf).mode != '\x01')) {
    uVar1._0_4_ = cpi->use_screen_content_tools;
    uVar1._4_4_ = cpi->is_screen_content_type;
    if (((undefined4)uVar1 == 0) && ((cpi->common).current_frame.frame_type == '\0')) {
      cm = &cpi->common;
      bVar12 = true;
      if ((cpi->oxcf).rc_cfg.best_allowed_q == 0) {
        bVar12 = (cpi->oxcf).rc_cfg.worst_allowed_q != 0;
      }
      q = 0xf4;
      if (0xf4 < q_orig) {
        q = q_orig;
      }
      _Var2 = (cpi->common).features.allow_screen_content_tools;
      if (!bVar12) {
        q = q_orig;
      }
      _Var3 = (cpi->common).features.allow_intrabc;
      PVar4 = (cpi->sf).part_sf.partition_search_type;
      BVar5 = (cpi->sf).part_sf.fixed_partition_size;
      pYVar7 = av1_realloc_and_scale_if_required
                         (cm,cpi->unscaled_source,&cpi->scaled_source,
                          (cpi->common).features.interp_filter,0,false,false,
                          (cpi->oxcf).border_in_pixels,cpi->alloc_pyramid);
      cpi->source = pYVar7;
      if (cpi->unscaled_last_source != (YV12_BUFFER_CONFIG *)0x0) {
        pYVar7 = av1_realloc_and_scale_if_required
                           (cm,cpi->unscaled_last_source,&cpi->scaled_last_source,
                            (cpi->common).features.interp_filter,0,false,false,
                            (cpi->oxcf).border_in_pixels,cpi->alloc_pyramid);
        cpi->last_source = pYVar7;
      }
      av1_setup_frame(cpi);
      seg = &(cpi->common).seg;
      if ((cpi->common).seg.enabled == '\0') {
        memset(seg,0,0xac);
      }
      else if (((cpi->common).seg.update_data == '\0') &&
              (pRVar6 = (cpi->common).prev_frame, pRVar6 != (RefCntBuffer *)0x0)) {
        paiVar8 = (pRVar6->seg).feature_data;
        paiVar9 = (cpi->common).seg.feature_data;
        lVar10 = 0;
        do {
          (cpi->common).seg.feature_mask[lVar10] = (pRVar6->seg).feature_mask[lVar10];
          lVar11 = 0;
          do {
            (*paiVar9)[lVar11] = (*paiVar8)[lVar11];
            lVar11 = lVar11 + 1;
          } while (lVar11 != 8);
          lVar10 = lVar10 + 1;
          paiVar9 = paiVar9 + 1;
          paiVar8 = paiVar8 + 1;
        } while (lVar10 != 8);
        (cpi->common).seg.segid_preskip = (pRVar6->seg).segid_preskip;
        (cpi->common).seg.last_active_segid = (pRVar6->seg).last_active_segid;
        (cpi->common).seg.enabled = (pRVar6->seg).enabled;
      }
      else {
        av1_calculate_segdata(seg);
      }
      pRVar6 = (cpi->common).cur_frame;
      paiVar9 = (cpi->common).seg.feature_data;
      paiVar8 = (pRVar6->seg).feature_data;
      lVar10 = 0;
      do {
        (pRVar6->seg).feature_mask[lVar10] = (cpi->common).seg.feature_mask[lVar10];
        lVar11 = 0;
        do {
          (*paiVar8)[lVar11] = (*paiVar9)[lVar11];
          lVar11 = lVar11 + 1;
        } while (lVar11 != 8);
        lVar10 = lVar10 + 1;
        paiVar8 = paiVar8 + 1;
        paiVar9 = paiVar9 + 1;
      } while (lVar10 != 8);
      (pRVar6->seg).segid_preskip = (cpi->common).seg.segid_preskip;
      (pRVar6->seg).last_active_segid = (cpi->common).seg.last_active_segid;
      (pRVar6->seg).enabled = (cpi->common).seg.enabled;
      lVar10 = 0;
      do {
        if (lVar10 == 0) {
          (cpi->common).features.allow_screen_content_tools = false;
          (cpi->common).features.allow_intrabc = false;
        }
        else {
          (cpi->common).features.allow_screen_content_tools = true;
        }
        cpi->use_screen_content_tools = (uint)(lVar10 != 0);
        (cpi->sf).part_sf.partition_search_type = '\x01';
        (cpi->sf).part_sf.fixed_partition_size = BLOCK_32X32;
        av1_set_quantizer(cm,(cpi->oxcf).q_cfg.qm_minlevel,(cpi->oxcf).q_cfg.qm_maxlevel,q,
                          (uint)(cpi->oxcf).q_cfg.enable_chroma_deltaq,
                          (uint)(cpi->oxcf).q_cfg.enable_hdr_deltaq,(cpi->oxcf).mode == '\x02',
                          (cpi->oxcf).tune_cfg.tuning);
        av1_set_speed_features_qindex_dependent(cpi,(cpi->oxcf).speed);
        av1_init_quantizer(&cpi->enc_quant_dequant_params,&(cpi->common).quant_params,
                           ((cpi->common).seq_params)->bit_depth,(cpi->oxcf).algo_cfg.sharpness);
        av1_set_variance_partition_thresholds(cpi,q,0);
        av1_encode_frame(cpi);
        aom_calc_highbd_psnr
                  (cpi->source,&((cpi->common).cur_frame)->buf,
                   (PSNR_STATS *)((long)psnr[0].psnr + lVar10),(cpi->td).mb.e_mbd.bd,
                   (cpi->oxcf).input_cfg.input_bit_depth);
        if (lVar10 == 0xa0) {
          if ((0.9 < psnr[1].psnr[0] - psnr[0].psnr[0]) ||
             (dVar15 = (double)cpi->palette_pixel_num /
                       (double)((cpi->common).width * (cpi->common).height),
             4.0 < (psnr[1].psnr[0] - psnr[0].psnr[0]) / dVar15 && 0.0001 <= dVar15)) {
            (cpi->common).features.allow_screen_content_tools = true;
            _Var13 = cpi->intrabc_used != 0;
            uVar14 = 0x100000001;
          }
          else {
            (cpi->common).features.allow_screen_content_tools = _Var2;
            uVar14 = uVar1;
            _Var13 = _Var3;
          }
          (cpi->common).features.allow_intrabc = _Var13;
          cpi->use_screen_content_tools = (int)uVar14;
          cpi->is_screen_content_type = (int)((ulong)uVar14 >> 0x20);
        }
        lVar10 = lVar10 + 0xa0;
      } while (lVar10 == 0xa0);
      (cpi->sf).part_sf.partition_search_type = PVar4;
      (cpi->sf).part_sf.fixed_partition_size = BVar5;
      if ((cpi->common).features.allow_screen_content_tools == false) {
        free_token_info(&cpi->token_info);
      }
    }
  }
  return;
}

Assistant:

void av1_determine_sc_tools_with_encoding(AV1_COMP *cpi, const int q_orig) {
  AV1_COMMON *const cm = &cpi->common;
  const AV1EncoderConfig *const oxcf = &cpi->oxcf;
  const QuantizationCfg *const q_cfg = &oxcf->q_cfg;
  // Variables to help determine if we should allow screen content tools.
  int projected_size_pass[3] = { 0 };
  PSNR_STATS psnr[3];
  const int is_key_frame = cm->current_frame.frame_type == KEY_FRAME;
  const int allow_screen_content_tools_orig_decision =
      cm->features.allow_screen_content_tools;
  const int allow_intrabc_orig_decision = cm->features.allow_intrabc;
  const int use_screen_content_tools_orig_decision =
      cpi->use_screen_content_tools;
  const int is_screen_content_type_orig_decision = cpi->is_screen_content_type;
  // Turn off the encoding trial for forward key frame and superres.
  if (cpi->sf.rt_sf.use_nonrd_pick_mode || oxcf->kf_cfg.fwd_kf_enabled ||
      cpi->superres_mode != AOM_SUPERRES_NONE || oxcf->mode == REALTIME ||
      use_screen_content_tools_orig_decision || !is_key_frame) {
    return;
  }

  // TODO(chengchen): multiple encoding for the lossless mode is time consuming.
  // Find a better way to determine whether screen content tools should be used
  // for lossless coding.
  // Use a high q and a fixed partition to do quick encoding.
  const int q_for_screen_content_quick_run =
      is_lossless_requested(&oxcf->rc_cfg) ? q_orig : AOMMAX(q_orig, 244);
  const int partition_search_type_orig = cpi->sf.part_sf.partition_search_type;
  const BLOCK_SIZE fixed_partition_block_size_orig =
      cpi->sf.part_sf.fixed_partition_size;

  // Setup necessary params for encoding, including frame source, etc.

  cpi->source = av1_realloc_and_scale_if_required(
      cm, cpi->unscaled_source, &cpi->scaled_source, cm->features.interp_filter,
      0, false, false, cpi->oxcf.border_in_pixels, cpi->alloc_pyramid);
  if (cpi->unscaled_last_source != NULL) {
    cpi->last_source = av1_realloc_and_scale_if_required(
        cm, cpi->unscaled_last_source, &cpi->scaled_last_source,
        cm->features.interp_filter, 0, false, false, cpi->oxcf.border_in_pixels,
        cpi->alloc_pyramid);
  }

  av1_setup_frame(cpi);

  if (cm->seg.enabled) {
    if (!cm->seg.update_data && cm->prev_frame) {
      segfeatures_copy(&cm->seg, &cm->prev_frame->seg);
      cm->seg.enabled = cm->prev_frame->seg.enabled;
    } else {
      av1_calculate_segdata(&cm->seg);
    }
  } else {
    memset(&cm->seg, 0, sizeof(cm->seg));
  }
  segfeatures_copy(&cm->cur_frame->seg, &cm->seg);
  cm->cur_frame->seg.enabled = cm->seg.enabled;

  // The two encoding passes aim to help determine whether to use screen
  // content tools, with a high q and fixed partition.
  for (int pass = 0; pass < 2; ++pass) {
    set_encoding_params_for_screen_content(cpi, pass);
    av1_set_quantizer(cm, q_cfg->qm_minlevel, q_cfg->qm_maxlevel,
                      q_for_screen_content_quick_run,
                      q_cfg->enable_chroma_deltaq, q_cfg->enable_hdr_deltaq,
                      oxcf->mode == ALLINTRA, oxcf->tune_cfg.tuning);
    av1_set_speed_features_qindex_dependent(cpi, oxcf->speed);

    av1_init_quantizer(&cpi->enc_quant_dequant_params, &cm->quant_params,
                       cm->seq_params->bit_depth, oxcf->algo_cfg.sharpness);

    av1_set_variance_partition_thresholds(cpi, q_for_screen_content_quick_run,
                                          0);
    // transform / motion compensation build reconstruction frame
    av1_encode_frame(cpi);
    // Screen content decision
    screen_content_tools_determination(
        cpi, allow_screen_content_tools_orig_decision,
        allow_intrabc_orig_decision, use_screen_content_tools_orig_decision,
        is_screen_content_type_orig_decision, pass, projected_size_pass, psnr);
  }

  // Set partition speed feature back.
  cpi->sf.part_sf.partition_search_type = partition_search_type_orig;
  cpi->sf.part_sf.fixed_partition_size = fixed_partition_block_size_orig;

  // Free token related info if screen content coding tools are not enabled.
  if (!cm->features.allow_screen_content_tools)
    free_token_info(&cpi->token_info);
}